

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toString(QLocale *this,double f,char format,int precision)

{
  char in_DL;
  QString *in_RDI;
  long in_FS_OFFSET;
  uint flags;
  DoubleForm form;
  uint in_stack_000000dc;
  int in_stack_000000e0;
  DoubleForm in_stack_000000e4;
  QLocaleData *in_stack_000000e8;
  int in_stack_0000026c;
  double in_stack_00000270;
  NumberOption in_stack_ffffffffffffff9c;
  QString *this_00;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_14;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_10;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QtMiscUtils::isAsciiUpper((int)in_DL);
  QtMiscUtils::toAsciiLower('\0');
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d01eb);
  local_c.super_QFlagsStorage<QLocale::NumberOption>.i =
       (QFlagsStorage<QLocale::NumberOption>)
       QFlags<QLocale::NumberOption>::operator&
                 ((QFlags<QLocale::NumberOption> *)this_00,in_stack_ffffffffffffff9c);
  ::QFlags::operator_cast_to_bool((QFlags *)&local_c);
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d0227);
  local_10.super_QFlagsStorage<QLocale::NumberOption>.i =
       (QFlagsStorage<QLocale::NumberOption>)
       QFlags<QLocale::NumberOption>::operator&
                 ((QFlags<QLocale::NumberOption> *)this_00,in_stack_ffffffffffffff9c);
  ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d0265);
  local_14.super_QFlagsStorage<QLocale::NumberOption>.i =
       (QFlagsStorage<QLocale::NumberOption>)
       QFlags<QLocale::NumberOption>::operator&
                 ((QFlags<QLocale::NumberOption> *)this_00,in_stack_ffffffffffffff9c);
  ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d029f);
  QLocaleData::doubleToString
            (in_stack_000000e8,in_stack_00000270,in_stack_0000026c,in_stack_000000e4,
             in_stack_000000e0,in_stack_000000dc);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toString(double f, char format, int precision) const
{
    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    uint flags = isAsciiUpper(format) ? QLocaleData::CapitalEorX : 0;

    switch (QtMiscUtils::toAsciiLower(format)) {
    case 'f':
        form = QLocaleData::DFDecimal;
        break;
    case 'e':
        form = QLocaleData::DFExponent;
        break;
    case 'g':
        form = QLocaleData::DFSignificantDigits;
        break;
    default:
        break;
    }

    if (!(d->m_numberOptions & OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;
    if (!(d->m_numberOptions & OmitLeadingZeroInExponent))
        flags |= QLocaleData::ZeroPadExponent;
    if (d->m_numberOptions & IncludeTrailingZeroesAfterDot)
        flags |= QLocaleData::AddTrailingZeroes;
    return d->m_data->doubleToString(f, precision, form, -1, flags);
}